

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_reset(REF_INTERP ref_interp)

{
  REF_INT max;
  int iVar1;
  REF_INT *pRVar2;
  uint uVar3;
  long lVar4;
  
  max = ref_interp->to_grid->node->max;
  iVar1 = ref_interp->max;
  if (0 < (long)iVar1) {
    lVar4 = 0;
    do {
      if (ref_interp->agent_hired[lVar4] != 0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",
               0xe1,"ref_interp_reset","agent should not be hired during reset");
        return 1;
      }
      lVar4 = lVar4 + 1;
    } while (iVar1 != lVar4);
  }
  if ((iVar1 < max) && (uVar3 = ref_interp_resize(ref_interp,max), uVar3 != 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",0xe4,
           "ref_interp_reset",(ulong)uVar3,"protective resize");
  }
  else {
    if (0 < ref_interp->max) {
      pRVar2 = ref_interp->cell;
      lVar4 = 0;
      do {
        pRVar2[lVar4] = -1;
        lVar4 = lVar4 + 1;
      } while (lVar4 < ref_interp->max);
    }
    if (ref_interp->max < 1) {
      uVar3 = 0;
    }
    else {
      pRVar2 = ref_interp->part;
      uVar3 = 0;
      lVar4 = 0;
      do {
        pRVar2[lVar4] = -1;
        lVar4 = lVar4 + 1;
      } while (lVar4 < ref_interp->max);
    }
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_interp_reset(REF_INTERP ref_interp) {
  REF_INT node_max =
      ref_node_max(ref_grid_node(ref_interp_to_grid(ref_interp)));
  REF_INT node;
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    RAS(!ref_interp->agent_hired[node],
        "agent should not be hired during reset");
  }
  if (node_max > ref_interp_max(ref_interp)) {
    RSS(ref_interp_resize(ref_interp, node_max), "protective resize");
  }
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    ref_interp->cell[node] = REF_EMPTY;
  }
  for (node = 0; node < ref_interp_max(ref_interp); node++) {
    ref_interp->part[node] = REF_EMPTY;
  }

  return REF_SUCCESS;
}